

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O0

monst * make_familiar(obj *otmp,xchar x,xchar y,boolean quietly)

{
  bool bVar1;
  boolean bVar2;
  int iVar3;
  int local_44;
  int local_38;
  int mndx;
  int trycnt;
  int chance;
  monst *mtmp;
  permonst *pm;
  boolean quietly_local;
  xchar y_local;
  xchar x_local;
  obj *otmp_local;
  
  _trycnt = (monst *)0x0;
  local_38 = 100;
  do {
    if (otmp == (obj *)0x0) {
      iVar3 = rn2(3);
      if (iVar3 == 0) {
        iVar3 = pet_type();
        mtmp = (monst *)(mons + iVar3);
      }
      else {
        mtmp = (monst *)rndmonst(level);
        if (mtmp == (monst *)0x0) {
          if (quietly == '\0') {
            pline("There seems to be nothing available for a familiar.");
          }
          break;
        }
      }
    }
    else {
      iVar3 = otmp->corpsenm;
      mtmp = (monst *)(mons + iVar3);
      if (((mvitals[iVar3].mvflags & 1) != 0) && (iVar3 = mbirth_limit(iVar3), iVar3 != 0x78)) {
        if (quietly == '\0') {
          pline("... into a pile of dust.");
        }
        break;
      }
    }
    _trycnt = makemon((permonst *)mtmp,level,(int)x,(int)y,0x84);
    if ((otmp != (obj *)0x0) && (_trycnt == (monst *)0x0)) {
      if (quietly == '\0') {
        pline("The figurine writhes and then shatters into pieces!");
      }
      break;
    }
    bVar1 = false;
    if (_trycnt == (monst *)0x0) {
      local_38 = local_38 + -1;
      bVar1 = 0 < local_38;
    }
  } while (bVar1);
  if (_trycnt == (monst *)0x0) {
    otmp_local = (obj *)0x0;
  }
  else {
    bVar2 = is_pool(level,(int)_trycnt->mx,(int)_trycnt->my);
    if ((bVar2 == '\0') || (iVar3 = minliquid(_trycnt), iVar3 == 0)) {
      initedog(_trycnt);
      *(uint *)&_trycnt->field_0x60 = *(uint *)&_trycnt->field_0x60 & 0xfff7ffff;
      if (otmp != (obj *)0x0) {
        mndx = rn2(10);
        if (2 < mndx) {
          if ((*(uint *)&otmp->field_0x4a >> 1 & 1) == 0) {
            local_44 = 2;
            if ((*(uint *)&otmp->field_0x4a & 1) == 0) {
              local_44 = 1;
            }
          }
          else {
            local_44 = 0;
          }
          mndx = local_44;
        }
        if ((0 < mndx) && (_trycnt->mtame = '\0', mndx == 2)) {
          if (quietly == '\0') {
            pline("You get a bad feeling about this.");
          }
          *(uint *)&_trycnt->field_0x60 = *(uint *)&_trycnt->field_0x60 & 0xffbfffff;
          set_malign(_trycnt);
        }
        if (otmp->onamelth != '\0') {
          _trycnt = christen_monst(_trycnt,(char *)((long)otmp->oextra + (long)(int)otmp->oxlth));
        }
      }
      set_malign(_trycnt);
      newsym((int)_trycnt->mx,(int)_trycnt->my);
      if ((_trycnt->mtame != '\0') && (bVar2 = attacktype(_trycnt->data,0xfe), bVar2 != '\0')) {
        _trycnt->weapon_check = '\x03';
        mon_wield_item(_trycnt);
      }
      otmp_local = (obj *)_trycnt;
    }
    else {
      otmp_local = (obj *)0x0;
    }
  }
  return (monst *)otmp_local;
}

Assistant:

struct monst *make_familiar(struct obj *otmp, xchar x, xchar y, boolean quietly)
{
	const struct permonst *pm;
	struct monst *mtmp = 0;
	int chance, trycnt = 100;

	do {
	    if (otmp) {	/* figurine; otherwise spell */
		int mndx = otmp->corpsenm;
		pm = &mons[mndx];
		/* activating a figurine provides one way to exceed the
		   maximum number of the target critter created--unless
		   it has a special limit (erinys, Nazgul) */
		if ((mvitals[mndx].mvflags & G_EXTINCT) &&
			mbirth_limit(mndx) != MAXMONNO) {
		    if (!quietly)
			/* have just been given "You <do something with>
			   the figurine and it transforms." message */
			pline("... into a pile of dust.");
		    break;	/* mtmp is null */
		}
	    } else if (!rn2(3)) {
		pm = &mons[pet_type()];
	    } else {
		pm = rndmonst(level);
		if (!pm) {
		  if (!quietly)
		    pline("There seems to be nothing available for a familiar.");
		  break;
		}
	    }

	    mtmp = makemon(pm, level, x, y, MM_EDOG|MM_IGNOREWATER);
	    if (otmp && !mtmp) { /* monster was genocided or square occupied */
	 	if (!quietly)
		   pline("The figurine writhes and then shatters into pieces!");
		break;
	    }
	} while (!mtmp && --trycnt > 0);

	if (!mtmp) return NULL;

	if (is_pool(level, mtmp->mx, mtmp->my) && minliquid(mtmp))
		return NULL;

	initedog(mtmp);
	mtmp->msleeping = 0;
	if (otmp) { /* figurine; resulting monster might not become a pet */
	    chance = rn2(10);	/* 0==tame, 1==peaceful, 2==hostile */
	    if (chance > 2) chance = otmp->blessed ? 0 : !otmp->cursed ? 1 : 2;
	    /* 0,1,2:  b=80%,10,10; nc=10%,80,10; c=10%,10,80 */
	    if (chance > 0) {
		mtmp->mtame = 0;	/* not tame after all */
		if (chance == 2) { /* hostile (cursed figurine) */
		    if (!quietly)
		       pline("You get a bad feeling about this.");
		    mtmp->mpeaceful = 0;
		    set_malign(mtmp);
		}
	    }
	    /* if figurine has been named, give same name to the monster */
	    if (otmp->onamelth)
		mtmp = christen_monst(mtmp, ONAME(otmp));
	}
	set_malign(mtmp); /* more alignment changes */
	newsym(mtmp->mx, mtmp->my);

	/* must wield weapon immediately since pets will otherwise drop it */
	if (mtmp->mtame && attacktype(mtmp->data, AT_WEAP)) {
		mtmp->weapon_check = NEED_HTH_WEAPON;
		mon_wield_item(mtmp);
	}
	return mtmp;
}